

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

_Bool __thiscall ImFont::IsGlyphRangeUnused(ImFont *this,uint c_begin,uint c_last)

{
  uint uVar1;
  
  for (uVar1 = c_begin >> 0xc;
      (uVar1 <= c_last >> 0xc &&
      ((0xf < uVar1 || ((this->Used4kPagesMap[uVar1 >> 3] >> (uVar1 & 7) & 1) == 0))));
      uVar1 = uVar1 + 1) {
  }
  return c_last >> 0xc < uVar1;
}

Assistant:

bool ImFont::IsGlyphRangeUnused(unsigned int c_begin, unsigned int c_last)
{
    unsigned int page_begin = (c_begin / 4096);
    unsigned int page_last = (c_last / 4096);
    for (unsigned int page_n = page_begin; page_n <= page_last; page_n++)
        if ((page_n >> 3) < sizeof(Used4kPagesMap))
            if (Used4kPagesMap[page_n >> 3] & (1 << (page_n & 7)))
                return false;
    return true;
}